

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

uint ParseToken(wchar_t **s,size_t count,wchar_t **token,uint *token_rc,uint token_not_found_rc)

{
  bool bVar1;
  int element_count1;
  ulong uVar2;
  bool bVar3;
  uint local_44;
  
  if ((*s != (wchar_t *)0x0) && ((uint)((**s & 0xffffffdfU) - 0x41U) < 0x1a)) {
    bVar3 = count != 0;
    if (bVar3) {
      uVar2 = 1;
      do {
        element_count1 = ON_wString::Length(token[uVar2 - 1]);
        bVar1 = ON_wString::EqualOrdinal(token[uVar2 - 1],element_count1,*s,element_count1,true);
        if (bVar1) {
          *s = *s + element_count1;
          local_44 = token_rc[uVar2 - 1];
          break;
        }
        bVar3 = uVar2 < count;
        bVar1 = uVar2 != count;
        uVar2 = uVar2 + 1;
      } while (bVar1);
    }
    if (bVar3) {
      return local_44;
    }
  }
  return 0;
}

Assistant:

static const unsigned int ParseToken(
  const wchar_t*& s,
  size_t count,
  const wchar_t*const* token,
  const unsigned int* token_rc,
  unsigned int token_not_found_rc
  )
{
  if (IsAtoZ(s))
  {
    for (size_t i = 0; i < count; i++)
    {
      const int len = (int)ON_wString::Length(token[i]);
      if (ON_wString::EqualOrdinal(token[i], len, s, len, true))
      {
        s += len;
        return token_rc[i];
      }
    }
  }
  return token_not_found_rc;
}